

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator)

{
  char *buffer;
  _func_int *p_Var1;
  string *src;
  bool bVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  pointer pUVar6;
  long lVar7;
  long lVar8;
  Hex hex;
  Hex hex_00;
  UnknownFieldSet embedded_unknown_fields;
  string field_number;
  undefined1 local_a8 [40];
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  AlphaNum local_60;
  
  pUVar6 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unknown_fields->fields_).
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6) >> 4)) {
    buffer = local_60.digits;
    lVar7 = 8;
    lVar8 = 0;
    do {
      local_60.piece_data_ = buffer;
      pcVar3 = FastInt32ToBufferLeft(*(int32 *)((long)pUVar6 + lVar7 + -8),buffer);
      local_60.piece_size_ = (long)pcVar3 - (long)buffer;
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,local_60.piece_data_,
                 local_60.piece_data_ + local_60.piece_size_);
      switch(*(undefined4 *)((long)pUVar6 + lVar7 + -4)) {
      case 0:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_80,local_78);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        local_60.piece_data_ = buffer;
        pcVar3 = FastUInt64ToBufferLeft(*(uint64 *)((long)&pUVar6->number_ + lVar7),buffer);
        local_60.piece_size_ = (long)pcVar3 - (long)buffer;
        local_a8._0_8_ = local_a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,local_60.piece_data_,
                   local_60.piece_data_ + local_60.piece_size_);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_a8._0_8_,local_a8._8_8_);
        break;
      case 1:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_80,local_78);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
        hex_00.value = (ulong)*(uint *)((long)&pUVar6->number_ + lVar7);
        hex_00._8_8_ = 8;
        strings::AlphaNum::AlphaNum(&local_60,hex_00);
        local_a8._0_8_ = local_a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,local_60.piece_data_,
                   local_60.piece_data_ + local_60.piece_size_);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_a8._0_8_,local_a8._8_8_);
        break;
      case 2:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_80,local_78);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
        hex._8_8_ = 0x10;
        hex.value = *(uint64 *)((long)&pUVar6->number_ + lVar7);
        strings::AlphaNum::AlphaNum(&local_60,hex);
        local_a8._0_8_ = local_a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,local_60.piece_data_,
                   local_60.piece_data_ + local_60.piece_size_);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_a8._0_8_,local_a8._8_8_);
        break;
      case 3:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_80,local_78);
        src = *(string **)((long)&pUVar6->number_ + lVar7);
        local_a8._0_8_ = (pointer)0x0;
        local_a8._8_8_ = (pointer)0x0;
        local_a8._16_8_ = (pointer)0x0;
        if ((src->_M_string_length == 0) ||
           (bVar2 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)local_a8,(src->_M_dataplus)._M_p,
                               (int)src->_M_string_length), !bVar2)) {
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": \"",3);
          CEscape((string *)&local_60,src);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                    (generator,local_60.piece_data_,local_60.piece_size_);
          if (local_60.piece_data_ != buffer) {
            operator_delete(local_60.piece_data_);
          }
          pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          pcVar3 = "\"\n";
          if (this->single_line_mode_ != false) {
            pcVar3 = "\" ";
          }
        }
        else {
          p_Var1 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
          if (this->single_line_mode_ == true) {
            (*p_Var1)(generator," { ",3);
          }
          else {
            (*p_Var1)(generator," {\n",3);
            (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
          }
          PrintUnknownFields(this,(UnknownFieldSet *)local_a8,generator);
          pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
          if (this->single_line_mode_ == true) {
            pp_Var4 = pp_Var4 + 5;
            pcVar3 = "} ";
          }
          else {
            (*pp_Var4[3])(generator);
            pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
            pcVar3 = "}\n";
          }
        }
        (**pp_Var4)(generator,pcVar3,2);
        if (local_a8._0_8_ != local_a8._8_8_) {
          UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_a8);
        }
        if ((pointer)local_a8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_a8._0_8_);
        }
        goto switchD_002a3684_default;
      case 4:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_80,local_78);
        p_Var1 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
        if (this->single_line_mode_ == true) {
          (*p_Var1)(generator," { ",3);
        }
        else {
          (*p_Var1)(generator," {\n",3);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        }
        PrintUnknownFields(this,*(UnknownFieldSet **)((long)&pUVar6->number_ + lVar7),generator);
        pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
        if (this->single_line_mode_ == true) {
          pp_Var4 = pp_Var4 + 5;
          uVar5 = 2;
          pcVar3 = "} ";
        }
        else {
          (*pp_Var4[3])(generator);
          pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          uVar5 = 2;
          pcVar3 = "}\n";
        }
        goto LAB_002a38d6;
      default:
        goto switchD_002a3684_default;
      }
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
      pp_Var4 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
      pcVar3 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar3 = " ";
      }
      uVar5 = 1;
LAB_002a38d6:
      (**pp_Var4)(generator,pcVar3,uVar5);
switchD_002a3684_default:
      if (local_80 != local_70) {
        operator_delete(local_80);
      }
      lVar8 = lVar8 + 1;
      pUVar6 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < (int)((ulong)((long)(unknown_fields->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar6)
                          >> 4));
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintLiteral(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && embedded_unknown_fields.ParseFromString(value)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintLiteral(" { ");
          } else {
            generator->PrintLiteral(" {\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message.
          // So it is probably just a plain string.
          generator->PrintLiteral(": \"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintLiteral(" { ");
        } else {
          generator->PrintLiteral(" {\n");
          generator->Indent();
        }
        PrintUnknownFields(field.group(), generator);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}